

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImVec2 *pIVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  ImDrawList *draw_list;
  bool bVar3;
  ImGuiContext *ctx;
  ImU32 tab_id;
  int iVar4;
  ImU32 col;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  ImVec2 IVar10;
  ImGuiID local_1cc;
  ImGuiCol local_1c8;
  ImGuiCol local_1c4;
  bool local_1ba;
  bool local_1b9;
  ImGuiDockNode *local_1b8;
  bool local_199;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  float local_14c;
  float local_148;
  float distance_from_edge_y;
  float threshold_y;
  float threshold_x;
  float threshold_base;
  bool undocking_tab;
  float drag_distance_from_edge_x;
  bool single_floating_window_node;
  ImGuiDockNode *node;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 IStack_120;
  ImGuiButtonFlags button_flags;
  ImVec2 local_118;
  ImVec2 backup_cursor_max_pos;
  ImVec2 local_104;
  bool local_f9;
  ImVec2 IStack_f8;
  bool want_clip_rect;
  undefined1 local_f0 [8];
  ImRect bb;
  ImVec2 pos;
  ImVec2 backup_main_cursor_pos;
  undefined1 local_a8 [4];
  bool tab_contents_visible;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  byte local_79;
  ImGuiTabItem *pIStack_78;
  bool tab_is_new;
  ImGuiTabItem *tab;
  float fStack_68;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *docked_window_local;
  bool *pbStack_28;
  ImGuiTabItemFlags flags_local;
  bool *p_open_local;
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab_bar->WantLayout & 1U) != 0) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    tab_id = TabBarCalcTabID(tab_bar,label);
    if ((p_open == (bool *)0x0) || ((*p_open & 1U) != 0)) {
      docked_window_local._4_4_ = flags;
      if ((flags & 0x100000U) == 0) {
        pbStack_28 = p_open;
        if (p_open == (bool *)0x0) {
          docked_window_local._4_4_ = flags | 0x100000;
        }
      }
      else {
        pbStack_28 = (bool *)0x0;
      }
      register0x00001200 = TabItemCalcSize(label,pbStack_28 != (bool *)0x0);
      pIStack_78 = TabBarFindTabByID(tab_bar,tab_id);
      local_79 = 0;
      bVar7 = pIStack_78 == (ImGuiTabItem *)0x0;
      if (bVar7) {
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)local_a8);
        ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)local_a8);
        pIStack_78 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
        pIStack_78->ID = tab_id;
        pIStack_78->Width = tab._4_4_;
      }
      local_79 = bVar7;
      iVar4 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIStack_78);
      tab_bar->LastTabItemIdx = (short)iVar4;
      pIStack_78->ContentWidth = tab._4_4_;
      bVar7 = tab_bar->PrevFrameVisible + 1 < ctx->FrameCount;
      bVar8 = (tab_bar->Flags & 0x200000U) != 0;
      bVar3 = pIStack_78->LastFrameVisible + 1 < ctx->FrameCount;
      pIStack_78->LastFrameVisible = ctx->FrameCount;
      pIStack_78->Flags = docked_window_local._4_4_;
      pIStack_78->Window = docked_window;
      if ((tab_bar->Flags & 0x100000U) == 0) {
        if (pIStack_78->Window != (ImGuiWindow *)0x0) {
          __assert_fail("tab->Window == __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                        ,0x1c42,
                        "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                       );
        }
        iVar4 = ImGuiTextBuffer::size(&tab_bar->TabsNames);
        pIStack_78->NameOffset = iVar4;
        sVar5 = strlen(label);
        ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar5 + 1);
      }
      else {
        if (pIStack_78->Window == (ImGuiWindow *)0x0) {
          __assert_fail("tab->Window != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                        ,0x1c3d,
                        "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                       );
        }
        pIStack_78->NameOffset = -1;
      }
      if ((!bVar3) && ((tab_bar->Flags & 1U) == 0)) {
        pIStack_78->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab =
             pIStack_78->Width + (ctx->Style).ItemInnerSpacing.x + tab_bar->OffsetNextTab;
      }
      if ((((bVar3) && ((tab_bar->Flags & 2U) != 0)) && (tab_bar->NextSelectedTabId == 0)) &&
         ((!bVar7 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      if (((docked_window_local._4_4_ & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      tab_bar_local._7_1_ = tab_bar->VisibleTabId == tab_id;
      if (tab_bar_local._7_1_) {
        tab_bar->VisibleTabWasSubmitted = true;
      }
      else if ((((tab_bar->SelectedTabId == 0) && (bVar7)) && (docked_window == (ImGuiWindow *)0x0))
              && (((tab_bar->Tabs).Size == 1 && ((tab_bar->Flags & 2U) == 0)))) {
        tab_bar_local._7_1_ = true;
      }
      if ((!bVar3) || ((bVar7 && ((local_79 & 1) == 0)))) {
        if (tab_bar->SelectedTabId == tab_id) {
          pIStack_78->LastFrameSelected = ctx->FrameCount;
        }
        IVar2 = (this->DC).CursorPos;
        stack0xffffffffffffff94 = (ImVec2)CONCAT44(fStack_68,pIStack_78->Width);
        ImVec2::ImVec2(&pos,(float)(int)(pIStack_78->Offset - tab_bar->ScrollingAnim),0.0);
        IVar10 = operator+(&(tab_bar->BarRect).Min,&pos);
        (this->DC).CursorPos = IVar10;
        bb.Max = (this->DC).CursorPos;
        IStack_f8 = operator+(&bb.Max,(ImVec2 *)((long)&tab + 4));
        ImRect::ImRect((ImRect *)local_f0,&bb.Max,&stack0xffffffffffffff08);
        local_199 = true;
        if ((tab_bar->BarRect).Min.x <= (float)local_f0._0_4_) {
          pIVar1 = &(tab_bar->BarRect).Max;
          local_199 = pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x;
        }
        local_f9 = local_199;
        if (local_199 != false) {
          fVar9 = ImMax<float>((float)local_f0._0_4_,(tab_bar->BarRect).Min.x);
          ImVec2::ImVec2(&local_104,fVar9,(float)local_f0._4_4_ - 1.0);
          ImVec2::ImVec2((ImVec2 *)&backup_cursor_max_pos.y,(tab_bar->BarRect).Max.x,bb.Min.y);
          PushClipRect(&local_104,(ImVec2 *)&backup_cursor_max_pos.y,true);
        }
        local_118 = (this->DC).CursorMaxPos;
        IStack_120 = ImRect::GetSize((ImRect *)local_f0);
        ItemSize(&stack0xfffffffffffffee0,(ctx->Style).FramePadding.y);
        (this->DC).CursorMaxPos = local_118;
        bVar7 = ItemAdd((ImRect *)local_f0,tab_id,(ImRect *)0x0);
        if (bVar7) {
          node._4_4_ = 0x102;
          if (((ctx->DragDropActive & 1U) != 0) &&
             (bVar7 = ImGuiPayload::IsDataType(&ctx->DragDropPayload,"_IMWINDOW"), !bVar7)) {
            node._4_4_ = node._4_4_ | 0x40;
          }
          node._1_1_ = ButtonBehavior((ImRect *)local_f0,tab_id,(bool *)((long)&node + 3),
                                      (bool *)((long)&node + 2),node._4_4_);
          if ((bool)node._1_1_) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          node._3_1_ = (node._3_1_ & 1) != 0 || ctx->HoveredId == tab_id;
          if (((((node._2_1_ & 1) != 0) && (docked_window != (ImGuiWindow *)0x0)) &&
              (ctx->ActiveId == tab_id)) && ((ctx->ActiveIdIsJustActivated & 1U) != 0)) {
            ctx->ActiveIdWindow = docked_window;
          }
          if ((node._2_1_ & 1) == 0) {
            SetItemAllowOverlap();
          }
          if (docked_window == (ImGuiWindow *)0x0) {
            local_1b8 = (ImGuiDockNode *)0x0;
          }
          else {
            local_1b8 = docked_window->DockNode;
          }
          _drag_distance_from_edge_x = local_1b8;
          local_1b9 = false;
          if (local_1b8 != (ImGuiDockNode *)0x0) {
            bVar7 = ImGuiDockNode::IsFloatingNode(local_1b8);
            local_1b9 = false;
            if (bVar7) {
              local_1b9 = (_drag_distance_from_edge_x->Windows).Size == 1;
            }
          }
          undocking_tab = local_1b9;
          if ((((node._2_1_ & 1) == 0) || (local_1b9 == false)) ||
             (bVar7 = IsMouseDragging(0,0.0), !bVar7)) {
            if ((((node._2_1_ & 1) != 0) && (!bVar3)) && (bVar7 = IsMouseDragging(0,-1.0), bVar7)) {
              threshold_base = 0.0;
              if (((ctx->DragDropActive & 1U) == 0) &&
                 (((tab_bar->Flags & 1U) != 0 || (docked_window != (ImGuiWindow *)0x0)))) {
                pIVar1 = &(ctx->IO).MouseDelta;
                if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
                   ((float)local_f0._0_4_ <= (ctx->IO).MousePos.x)) {
                  if (((0.0 < (ctx->IO).MouseDelta.x) && (bb.Min.x < (ctx->IO).MousePos.x)) &&
                     (threshold_base = (ctx->IO).MousePos.x - bb.Min.x, (tab_bar->Flags & 1U) != 0))
                  {
                    TabBarQueueChangeTabOrder(tab_bar,pIStack_78,1);
                  }
                }
                else {
                  threshold_base = (float)local_f0._0_4_ - (ctx->IO).MousePos.x;
                  if ((tab_bar->Flags & 1U) != 0) {
                    TabBarQueueChangeTabOrder(tab_bar,pIStack_78,-1);
                  }
                }
              }
              if ((docked_window != (ImGuiWindow *)0x0) && ((docked_window->Flags & 4U) == 0)) {
                local_1ba = false;
                if ((ctx->DragDropActive & 1U) != 0) {
                  local_1ba = (ctx->DragDropPayload).SourceId == tab_id;
                }
                threshold_x._3_1_ = local_1ba;
                if (local_1ba == false) {
                  fVar9 = ctx->FontSize;
                  distance_from_edge_y = fVar9 * 2.2;
                  threshold_y = fVar9;
                  local_148 = ImClamp<float>((-fVar9 + -fVar9 +
                                             ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x)) * 0.2,0.0,
                                             fVar9 * 4.0);
                  local_148 = fVar9 * 1.5 + local_148;
                  local_14c = ImMax<float>((float)local_f0._4_4_ - (ctx->IO).MousePos.y,
                                           (ctx->IO).MousePos.y - bb.Min.y);
                  if (local_14c < local_148) {
                    if ((distance_from_edge_y < threshold_base) &&
                       (((tab_bar->ReorderRequestDir < '\0' &&
                         (iVar4 = ImGuiTabBar::GetTabOrder(tab_bar,pIStack_78), iVar4 == 0)) ||
                        (('\0' < tab_bar->ReorderRequestDir &&
                         (iVar4 = ImGuiTabBar::GetTabOrder(tab_bar,pIStack_78),
                         iVar4 == (tab_bar->Tabs).Size + -1)))))) {
                      threshold_x._3_1_ = 1;
                    }
                  }
                  else {
                    threshold_x._3_1_ = 1;
                  }
                }
                if ((threshold_x._3_1_ & 1) != 0) {
                  DockContextQueueUndockWindow(ctx,docked_window);
                  ctx->MovingWindow = docked_window;
                  ctx->ActiveId = ctx->MovingWindow->MoveId;
                  register0x00001200 = ::operator-(&ctx->MovingWindow->Pos,(ImVec2 *)local_f0);
                  operator-=(&ctx->ActiveIdClickOffset,(ImVec2 *)((long)&display_draw_list + 4));
                }
              }
            }
          }
          else {
            StartMouseMovingWindow(docked_window);
          }
          draw_list = this->DrawList;
          if (((node._2_1_ & 1) == 0) && ((node._3_1_ & 1) == 0)) {
            if (tab_bar_local._7_1_ == false) {
              local_1c8 = 0x24;
              if (bVar8) {
                local_1c8 = 0x21;
              }
            }
            else {
              local_1c8 = 0x25;
              if (bVar8) {
                local_1c8 = 0x23;
              }
            }
            local_1c4 = local_1c8;
          }
          else {
            local_1c4 = 0x22;
          }
          col = GetColorU32(local_1c4,1.0);
          TabItemBackground(draw_list,(ImRect *)local_f0,docked_window_local._4_4_,col);
          RenderNavHighlight((ImRect *)local_f0,tab_id,1);
          bVar7 = IsItemHovered(8);
          if ((bVar7) &&
             ((bVar7 = IsMouseClicked(1,false), bVar7 || (bVar7 = IsMouseReleased(1), bVar7)))) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          if ((tab_bar->Flags & 8U) != 0) {
            docked_window_local._4_4_ = docked_window_local._4_4_ | 4;
          }
          if (pbStack_28 == (bool *)0x0) {
            local_1cc = 0;
          }
          else {
            local_1cc = ImGuiWindow::GetID(this,(void *)((ulong)tab_id + 1));
          }
          bVar7 = TabItemLabelAndCloseButton
                            (draw_list,(ImRect *)local_f0,docked_window_local._4_4_,
                             tab_bar->FramePadding,label,tab_id,local_1cc,tab_bar_local._7_1_);
          if ((bVar7) && (pbStack_28 != (bool *)0x0)) {
            *pbStack_28 = false;
            TabBarCloseTab(tab_bar,pIStack_78);
          }
          if ((local_f9 & 1U) != 0) {
            PopClipRect();
          }
          (this->DC).CursorPos = IVar2;
          if (((((ctx->HoveredId == tab_id) && ((node._2_1_ & 1) == 0)) &&
               (0.5 < ctx->HoveredIdNotActiveTimer)) &&
              ((bVar7 = IsItemHovered(0), bVar7 && ((tab_bar->Flags & 0x20U) == 0)))) &&
             ((pIStack_78->Flags & 0x10U) == 0)) {
            pcVar6 = FindRenderedTextEnd(label,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar6 - (int)label),label);
          }
        }
        else {
          if ((local_f9 & 1U) != 0) {
            PopClipRect();
          }
          (this->DC).CursorPos = IVar2;
        }
      }
      else {
        PushItemFlag(0x18,true);
        ImRect::ImRect((ImRect *)&backup_main_cursor_pos.y);
        ItemAdd((ImRect *)&backup_main_cursor_pos.y,tab_id,(ImRect *)0x0);
        PopItemFlag();
      }
    }
    else {
      PushItemFlag(0x18,true);
      ImRect::ImRect((ImRect *)&size);
      ItemAdd((ImRect *)&size,tab_id,(ImRect *)0x0);
      PopItemFlag();
      tab_bar_local._7_1_ = false;
    }
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}